

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.H
# Opt level: O1

void amrex::EB2::Build<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>
               (GeometryShop<amrex::EB2::SphereIF,_int> *gshop,Geometry *geom,
               int required_coarsening_level,int max_coarsening_level,int ngrow,
               bool build_coarse_level_by_coarsening,bool extend_domain_face,int num_coarsen_opt)

{
  IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_> *this;
  IndexSpace *unaff_retaddr;
  
  this = (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_> *)operator_new(0xa0);
  IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,_int>_>::IndexSpaceImp
            (this,gshop,geom,required_coarsening_level,max_coarsening_level,ngrow,
             build_coarse_level_by_coarsening,extend_domain_face,num_coarsen_opt);
  IndexSpace::push(unaff_retaddr);
  return;
}

Assistant:

void
Build (const G& gshop, const Geometry& geom,
       int required_coarsening_level, int max_coarsening_level,
       int ngrow = 4, bool build_coarse_level_by_coarsening = true,
       bool extend_domain_face = ExtendDomainFace(),
       int num_coarsen_opt = NumCoarsenOpt())
{
    BL_PROFILE("EB2::Initialize()");
    IndexSpace::push(new IndexSpaceImp<G>(gshop, geom,
                                          required_coarsening_level,
                                          max_coarsening_level,
                                          ngrow, build_coarse_level_by_coarsening,
                                          extend_domain_face,
                                          num_coarsen_opt));
}